

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O0

void __thiscall QFileDialogPrivate::updateFileNameLabel(QFileDialogPrivate *this)

{
  FileMode FVar1;
  QFileDialogOptions *pQVar2;
  ulong uVar3;
  QFileDialogPrivate *in_RDI;
  long in_FS_OFFSET;
  int in_stack_ffffffffffffff9c;
  QFileDialogPrivate *s;
  QString *in_stack_ffffffffffffffc0;
  DialogLabel in_stack_ffffffffffffffcc;
  QFileDialogPrivate *in_stack_ffffffffffffffd0;
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  s = in_RDI;
  pQVar2 = QSharedPointer<QFileDialogOptions>::operator->
                     ((QSharedPointer<QFileDialogOptions> *)0x766da1);
  uVar3 = QFileDialogOptions::isLabelExplicitlySet((DialogLabel)pQVar2);
  if ((uVar3 & 1) == 0) {
    q_func(in_RDI);
    FVar1 = QFileDialog::fileMode((QFileDialog *)in_RDI);
    if (FVar1 == Directory) {
      QFileDialog::tr((char *)s,(char *)in_RDI,in_stack_ffffffffffffff9c);
      setLabelTextControl(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
                          in_stack_ffffffffffffffc0);
      QString::~QString((QString *)0x766e4b);
    }
    else {
      QFileDialog::tr((char *)s,(char *)in_RDI,in_stack_ffffffffffffff9c);
      setLabelTextControl(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
                          in_stack_ffffffffffffffc0);
      QString::~QString((QString *)0x766e85);
    }
  }
  else {
    QSharedPointer<QFileDialogOptions>::operator->((QSharedPointer<QFileDialogOptions> *)0x766dc5);
    QFileDialogOptions::labelText((DialogLabel)local_20);
    setLabelTextControl(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
                        in_stack_ffffffffffffffc0);
    QString::~QString((QString *)0x766df5);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFileDialogPrivate::updateFileNameLabel()
{
    if (options->isLabelExplicitlySet(QFileDialogOptions::FileName)) {
        setLabelTextControl(QFileDialog::FileName, options->labelText(QFileDialogOptions::FileName));
    } else {
        switch (q_func()->fileMode()) {
        case QFileDialog::Directory:
            setLabelTextControl(QFileDialog::FileName, QFileDialog::tr("Directory:"));
            break;
        default:
            setLabelTextControl(QFileDialog::FileName, QFileDialog::tr("File &name:"));
            break;
        }
    }
}